

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O1

void Dar_ObjCutPrint(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  Dar_Cut_t *pCut;
  
  uVar1 = 0;
  printf("Cuts for node %d:\n",(ulong)(uint)pObj->Id);
  if (pObj->field_0x1f != '\0') {
    pCut = (Dar_Cut_t *)(pObj->field_5).pData;
    do {
      if ((pCut->field_0x7 & 0x10) != 0) {
        Dar_CutPrint(pCut);
      }
      uVar1 = uVar1 + 1;
      pCut = pCut + 1;
    } while (uVar1 < (byte)pObj->field_0x1f);
  }
  return;
}

Assistant:

void Dar_ObjCutPrint( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCut;
    int i;
    printf( "Cuts for node %d:\n", pObj->Id );
    Dar_ObjForEachCut( pObj, pCut, i )
        Dar_CutPrint( pCut );
//    printf( "\n" );
}